

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UserInterface.cpp
# Opt level: O1

void __thiscall
TextField::TextField
          (TextField *this,string *labelText,string *initialFieldText,Color *textColor,uint charSize
          ,float x,float y,Color *fillColor,Color *outlineColor,int maxCharacters,bool isEditable)

{
  Text *this_00;
  Text *this_01;
  RectangleShape *pRVar1;
  int iVar2;
  Font *pFVar3;
  Vector2f VVar4;
  FloatRect FVar5;
  string maxSizeField;
  undefined1 local_b8 [16];
  undefined1 local_a8 [16];
  string local_98;
  RectangleShape *local_78;
  Transformable *local_70;
  string *local_68;
  locale local_60 [8];
  Color *local_58;
  string local_50;
  
  (this->super_UIComponent).super_Drawable._vptr_Drawable = (_func_int **)&PTR__Drawable_001d19b0;
  local_70 = &(this->super_UIComponent).super_Transformable;
  local_68 = initialFieldText;
  sf::Transformable::Transformable(local_70);
  (this->super_UIComponent).super_Transformable.field_0xa9 = 1;
  (this->super_UIComponent).super_Drawable._vptr_Drawable = (_func_int **)&PTR__TextField_001d21d0;
  (this->super_UIComponent).super_Transformable._vptr_Transformable =
       (_func_int **)&PTR__TextField_001d2208;
  this_00 = &this->label;
  sf::Text::Text(this_00);
  this_01 = &this->field;
  local_58 = fillColor;
  sf::Text::Text(this_01);
  pRVar1 = &this->background;
  local_98._M_dataplus._M_p = (pointer)0x0;
  sf::RectangleShape::RectangleShape(pRVar1,(Vector2f *)&local_98);
  local_78 = &this->caret;
  local_98._M_dataplus._M_p = (pointer)0x0;
  sf::RectangleShape::RectangleShape(local_78,(Vector2f *)&local_98);
  pFVar3 = Board::getFont();
  sf::Text::setFont(this_00,pFVar3);
  std::locale::locale((locale *)local_b8);
  sf::String::String((String *)&local_98,labelText,(locale *)local_b8);
  sf::Text::setString(this_00,(String *)&local_98);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p);
  }
  std::locale::~locale((locale *)local_b8);
  sf::Text::setFillColor(this_00,textColor);
  sf::Text::setCharacterSize(this_00,charSize);
  sf::Transformable::setPosition(&(this->label).super_Transformable,0.0,0.0);
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  std::__cxx11::string::_M_construct((ulong)&local_98,(char)maxCharacters);
  pFVar3 = Board::getFont();
  sf::Text::setFont(this_01,pFVar3);
  std::locale::locale((locale *)&local_50);
  sf::String::String((String *)local_b8,&local_98,(locale *)&local_50);
  sf::Text::setString(this_01,(String *)local_b8);
  if ((undefined1 *)CONCAT44(local_b8._4_4_,local_b8._0_4_) != local_a8) {
    operator_delete((undefined1 *)CONCAT44(local_b8._4_4_,local_b8._0_4_));
  }
  std::locale::~locale((locale *)&local_50);
  sf::Text::setFillColor(this_01,textColor);
  sf::Text::setCharacterSize(this_01,charSize);
  FVar5 = sf::Text::getLocalBounds(this_00);
  sf::Transformable::setPosition(&(this->field).super_Transformable,FVar5.width + 5.0,0.0);
  FVar5 = sf::Text::getLocalBounds(this_01);
  local_b8._0_4_ = FVar5.width + 10.0;
  local_b8._4_4_ = (float)charSize * 1.5;
  sf::RectangleShape::setSize(pRVar1,(Vector2f *)local_b8);
  sf::Shape::setFillColor(&pRVar1->super_Shape,local_58);
  sf::Shape::setOutlineColor(&pRVar1->super_Shape,outlineColor);
  sf::Shape::setOutlineThickness(&pRVar1->super_Shape,-2.0);
  FVar5 = sf::Text::getLocalBounds(this_00);
  sf::Transformable::setPosition
            (&(this->background).super_Shape.super_Transformable,FVar5.width,0.0);
  pRVar1 = local_78;
  iVar2 = (int)local_68->_M_string_length;
  if (maxCharacters <= iVar2) {
    iVar2 = maxCharacters;
  }
  local_b8._4_4_ = (float)charSize * 1.5 + -4.0;
  this->caretPosition = iVar2;
  local_b8._0_4_ = 2.0;
  sf::RectangleShape::setSize(local_78,(Vector2f *)local_b8);
  sf::Shape::setFillColor(&pRVar1->super_Shape,textColor);
  VVar4 = sf::Text::findCharacterPos(this_01,(long)this->caretPosition);
  sf::Transformable::setPosition(&(this->caret).super_Shape.super_Transformable,VVar4.x,2.0);
  std::__cxx11::string::substr((ulong)&local_50,(ulong)local_68);
  std::locale::locale(local_60);
  sf::String::String((String *)local_b8,&local_50,local_60);
  sf::Text::setString(this_01,(String *)local_b8);
  if ((undefined1 *)CONCAT44(local_b8._4_4_,local_b8._0_4_) != local_a8) {
    operator_delete((undefined1 *)CONCAT44(local_b8._4_4_,local_b8._0_4_));
  }
  std::locale::~locale(local_60);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  sf::Transformable::setPosition(local_70,x,y);
  this->maxCharacters = maxCharacters;
  this->selected = false;
  this->isEditable = isEditable;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p);
  }
  return;
}

Assistant:

TextField::TextField(const string& labelText, const string& initialFieldText, const Color& textColor, unsigned int charSize, float x, float y, const Color& fillColor, const Color& outlineColor, int maxCharacters, bool isEditable) {
    label.setFont(Board::getFont());
    label.setString(labelText);
    label.setFillColor(textColor);
    label.setCharacterSize(charSize);
    label.setPosition(0.0f, 0.0f);
    
    string maxSizeField(maxCharacters, ' ');
    field.setFont(Board::getFont());
    field.setString(maxSizeField);
    field.setFillColor(textColor);
    field.setCharacterSize(charSize);
    field.setPosition(label.getLocalBounds().width + 5.0f, 0.0f);
    
    background.setSize(Vector2f(field.getLocalBounds().width + 10.0f, charSize * 1.5f));
    background.setFillColor(fillColor);
    background.setOutlineColor(outlineColor);
    background.setOutlineThickness(-2.0f);
    background.setPosition(label.getLocalBounds().width, 0.0f);
    
    caretPosition = min(maxCharacters, static_cast<int>(initialFieldText.length()));
    caret.setSize(Vector2f(2.0f, charSize * 1.5f - 4.0f));
    caret.setFillColor(textColor);
    caret.setPosition(field.findCharacterPos(caretPosition).x, 2.0f);
    field.setString(initialFieldText.substr(0, maxCharacters));
    
    setPosition(x, y);
    this->maxCharacters = maxCharacters;
    selected = false;
    this->isEditable = isEditable;
}